

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QGraphicsObject *item)

{
  char *pcVar1;
  undefined8 uVar2;
  long lVar3;
  storage_type *psVar4;
  undefined8 *in_RDX;
  storage_type *psVar5;
  QTextStream *pQVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebugStateSaver saver;
  QDebug local_58;
  undefined1 *local_50;
  QArrayData *local_48;
  undefined8 *local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)item);
  pQVar6 = *(QTextStream **)item;
  pQVar6[0x30] = (QTextStream)0x0;
  if (in_RDX == (undefined8 *)0x0) {
    QVar7.m_data = (storage_type *)0x12;
    QVar7.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(pQVar6,(QString *)&local_48);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    pQVar6 = *(QTextStream **)item;
    if (pQVar6[0x30] == (QTextStream)0x0) goto LAB_005f883f;
  }
  else {
    (**(code **)*in_RDX)();
    lVar3 = QMetaObject::className();
    pQVar6 = *(QTextStream **)item;
    if (lVar3 == 0) {
      psVar5 = (storage_type *)0x0;
    }
    else {
      psVar4 = (storage_type *)0xffffffffffffffff;
      do {
        psVar5 = psVar4 + 1;
        pcVar1 = psVar4 + lVar3 + 1;
        psVar4 = psVar5;
      } while (*pcVar1 != '\0');
    }
    QVar8.m_data = psVar5;
    QVar8.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<(pQVar6,(QString *)&local_48);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    if ((*(QTextStream **)item)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)item,' ');
    }
    QTextStream::operator<<(*(QTextStream **)item,'(');
    if ((*(QTextStream **)item)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)item,' ');
    }
    QTextStream::operator<<(*(QTextStream **)item,in_RDX);
    if ((*(QTextStream **)item)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)item,' ');
    }
    QObject::objectName();
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    if (local_38 != 0) {
      pQVar6 = *(QTextStream **)item;
      QVar9.m_data = (storage_type *)0x7;
      QVar9.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<(pQVar6,(QString *)&local_48);
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,0x10);
        }
      }
      if ((*(QTextStream **)item)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)item,' ');
      }
      QObject::objectName();
      if (local_40 == (undefined8 *)0x0) {
        local_40 = &QString::_empty;
      }
      QDebug::putString((QChar *)item,(ulong)local_40);
      if ((*(QTextStream **)item)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)item,' ');
      }
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,0x10);
        }
      }
    }
    local_58.stream = *(Stream **)item;
    *(int *)(local_58.stream + 0x28) = *(int *)(local_58.stream + 0x28) + 1;
    formatGraphicsItemHelper(&local_58,(QGraphicsItem *)(in_RDX + 2));
    QDebug::~QDebug(&local_58);
    QTextStream::operator<<(*(QTextStream **)item,')');
    pQVar6 = *(QTextStream **)item;
    if (pQVar6[0x30] != (QTextStream)0x1) goto LAB_005f883f;
  }
  QTextStream::operator<<(pQVar6,' ');
LAB_005f883f:
  uVar2 = *(undefined8 *)item;
  *(undefined8 *)item = 0;
  *(undefined8 *)debug.stream = uVar2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)debug.stream;
}

Assistant:

QDebug operator<<(QDebug debug, const QGraphicsObject *item)
{
    QDebugStateSaver saver(debug);
    debug.nospace();

    if (!item) {
        debug << "QGraphicsObject(0)";
        return debug;
    }

    debug << item->metaObject()->className() << '(' << static_cast<const void *>(item);
    if (!item->objectName().isEmpty())
        debug << ", name=" << item->objectName();
    formatGraphicsItemHelper(debug, item);
    debug << ')';
    return debug;
}